

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

void __thiscall
cppcms::application_specific_pool::put(application_specific_pool *this,application *a)

{
  _data *p_Var1;
  _policy *p_Var2;
  unique_lock<std::recursive_mutex> g;
  unique_lock<std::recursive_mutex> local_28;
  
  p_Var1 = (this->d).ptr_;
  if (p_Var1->flags == -1) {
    if (a != (application *)0x0) {
      (*a->_vptr_application[1])(a);
      return;
    }
  }
  else {
    p_Var2 = (p_Var1->policy).ptr_;
    if (p_Var2->lock_on_get_put != true) {
      (*p_Var2->_vptr__policy[6])(p_Var2,a);
      return;
    }
    local_28._M_device = &p_Var1->lock;
    local_28._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_28);
    local_28._M_owns = true;
    p_Var2 = (((this->d).ptr_)->policy).ptr_;
    (*p_Var2->_vptr__policy[6])(p_Var2,a);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  }
  return;
}

Assistant:

void application_specific_pool::put(application *a)
{
	if(d->flags == -1) {
		delete a;
		return;
	}
	assert(d->policy.get());
	if(d->policy->lock_on_get_put) {
		booster::unique_lock<booster::recursive_mutex> g(d->lock);
		d->policy->put(a);
	}
	else {
		d->policy->put(a);
	}
}